

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::printMemoryHeader(PrintSExpression *this,Memory *curr)

{
  bool bVar1;
  ostream *poVar2;
  address64_t aVar3;
  string_view local_38;
  string_view local_28;
  Memory *local_18;
  Memory *curr_local;
  PrintSExpression *this_local;
  
  local_18 = curr;
  curr_local = (Memory *)this;
  std::operator<<(this->o,'(');
  poVar2 = this->o;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"memory");
  poVar2 = printMedium(poVar2,local_28);
  std::operator<<(poVar2,' ');
  poVar2 = wasm::Name::print((Name *)local_18,this->o);
  std::operator<<(poVar2,' ');
  bVar1 = Memory::is64(local_18);
  if (bVar1) {
    std::operator<<(this->o,"i64 ");
  }
  poVar2 = this->o;
  aVar3 = wasm::Address::operator_cast_to_unsigned_long(&local_18->initial);
  std::ostream::operator<<(poVar2,aVar3);
  bVar1 = Memory::hasMax(local_18);
  if (bVar1) {
    poVar2 = std::operator<<(this->o,' ');
    aVar3 = wasm::Address::operator_cast_to_unsigned_long(&local_18->max);
    std::ostream::operator<<(poVar2,aVar3);
  }
  if ((local_18->shared & 1U) != 0) {
    poVar2 = this->o;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38," shared");
    printMedium(poVar2,local_38);
  }
  std::operator<<(this->o,")");
  return;
}

Assistant:

void PrintSExpression::printMemoryHeader(Memory* curr) {
  o << '(';
  printMedium(o, "memory") << ' ';
  curr->name.print(o) << ' ';
  if (curr->is64()) {
    o << "i64 ";
  }
  o << curr->initial;
  if (curr->hasMax()) {
    o << ' ' << curr->max;
  }
  if (curr->shared) {
    printMedium(o, " shared");
  }
  o << ")";
}